

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O2

bool kratos::check_stmt_condition
               (Stmt *stmt,function<bool_(kratos::Stmt_*)> *cond,bool check_unreachable,
               bool full_branch)

{
  undefined1 stmt_00 [8];
  bool bVar1;
  bool bVar2;
  char cVar3;
  byte bVar4;
  long lVar5;
  uint64_t index;
  pointer ppVar6;
  long lVar7;
  undefined8 *puVar8;
  iterator iVar9;
  InternalException *pIVar10;
  StmtException *this;
  undefined7 in_register_00000009;
  undefined7 in_register_00000011;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  __shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *p_Var15;
  const_iterator local_b0;
  const_iterator local_a8;
  long local_a0;
  undefined1 local_98 [8];
  undefined1 local_90 [40];
  undefined1 local_68 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  function<bool_(kratos::Stmt_*)> *local_48;
  allocator<char> local_39;
  uint local_38;
  uint local_34;
  
  local_48 = (function<bool_(kratos::Stmt_*)> *)
             CONCAT44(local_48._4_4_,(int)CONCAT71(in_register_00000009,full_branch));
  local_a0 = CONCAT44(local_a0._4_4_,(int)CONCAT71(in_register_00000011,check_unreachable));
  local_34 = (uint)check_unreachable;
  local_38 = 1;
  do {
    bVar1 = std::function<bool_(kratos::Stmt_*)>::operator()(cond,stmt);
    if (bVar1) {
      return true;
    }
    bVar1 = (bool)(char)local_48;
    switch(stmt->type_) {
    case If:
      lVar5 = __dynamic_cast(stmt,&Stmt::typeinfo,&IfStmt::typeinfo);
      if (lVar5 == 0) {
        pIVar10 = (InternalException *)__cxa_allocate_exception(0x10);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_98,"Statement is not if but is marked as StatementType::If",
                   (allocator<char> *)local_68);
        InternalException::InternalException(pIVar10,(string *)local_98);
        __cxa_throw(pIVar10,&InternalException::typeinfo,std::runtime_error::~runtime_error);
      }
      if ((char)local_48 == '\0') {
        bVar1 = check_stmt_condition(*(Stmt **)(lVar5 + 0xe0),cond,SUB41(local_34,0),false);
        if (bVar1) {
          return true;
        }
      }
      else {
        bVar1 = check_stmt_condition(*(Stmt **)(lVar5 + 0xe0),cond,SUB41(local_34,0),true);
        if (!bVar1) {
          return false;
        }
      }
      stmt = *(Stmt **)(lVar5 + 0xf0);
      break;
    case Switch:
      lVar5 = __dynamic_cast(stmt,&Stmt::typeinfo,&SwitchStmt::typeinfo,0);
      if (lVar5 == 0) {
        pIVar10 = (InternalException *)__cxa_allocate_exception(0x10);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_98,
                   "Statement is not switch but is marked as StatementType::Switch",
                   (allocator<char> *)local_68);
        InternalException::InternalException(pIVar10,(string *)local_98);
        __cxa_throw(pIVar10,&InternalException::typeinfo,std::runtime_error::~runtime_error);
      }
      std::
      _Rb_tree<std::shared_ptr<kratos::Const>,_std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>,_std::_Select1st<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>,_std::less<std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>_>
      ::_Rb_tree((_Rb_tree<std::shared_ptr<kratos::Const>,_std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>,_std::_Select1st<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>,_std::less<std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>_>
                  *)local_98,
                 (_Rb_tree<std::shared_ptr<kratos::Const>,_std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>,_std::_Select1st<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>,_std::less<std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>_>
                  *)(lVar5 + 0xe0));
      uVar12 = 0;
      if ((pointer)local_90._32_8_ == (pointer)0x0) goto LAB_001df9a0;
      cVar3 = (char)local_48;
      ppVar6 = (pointer)local_90._16_8_;
      local_a0 = lVar5;
      goto LAB_001df792;
    case For:
      lVar5 = __dynamic_cast(stmt,&Stmt::typeinfo,&ForStmt::typeinfo,0);
      if (lVar5 != 0) {
        std::__shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  ((__shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2> *)local_98,
                   (__shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2> *)
                   (lVar5 + 0xe8));
        bVar1 = check_stmt_condition((Stmt *)local_98,cond,SUB41(local_34,0),bVar1);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_90);
        return bVar1;
      }
      pIVar10 = (InternalException *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_98,"Statement is not if but is marked as StatementType::For",
                 (allocator<char> *)local_68);
      InternalException::InternalException(pIVar10,(string *)local_98);
      __cxa_throw(pIVar10,&InternalException::typeinfo,std::runtime_error::~runtime_error);
    default:
      return false;
    case Block:
      local_48 = cond;
      index = __dynamic_cast(stmt,&Stmt::typeinfo,&StmtBlock::typeinfo,0);
      if (index == 0) {
        pIVar10 = (InternalException *)__cxa_allocate_exception(0x10);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_98,"Statement is not block but is marked as StatementType::Block"
                   ,(allocator<char> *)local_68);
        InternalException::InternalException(pIVar10,(string *)local_98);
        __cxa_throw(pIVar10,&InternalException::typeinfo,std::runtime_error::~runtime_error);
      }
      uVar14 = *(long *)(index + 200) - *(long *)(index + 0xc0) >> 4;
      uVar13 = 0;
      goto LAB_001df6db;
    }
  } while( true );
LAB_001df6db:
  uVar11 = uVar14;
  if (uVar14 == uVar13) {
LAB_001df7dd:
    if (((byte)local_a0 & uVar13 < uVar14) != 1) {
      return uVar13 < uVar14;
    }
    lVar5 = *(long *)(index + 0xc0);
    lVar7 = *(long *)(index + 200);
    if (uVar11 == (lVar7 - lVar5 >> 4) - 1U) {
      return true;
    }
    local_68._0_8_ = (element_type *)0x0;
    local_68._8_8_ = 0;
    local_58._0_8_ = 0;
    while (uVar11 = uVar11 + 1, uVar11 < (ulong)(lVar7 - lVar5 >> 4)) {
      StmtBlock::get_stmt((StmtBlock *)local_98,index);
      local_a8._M_current = (Stmt **)local_98;
      std::vector<kratos::Stmt*,std::allocator<kratos::Stmt*>>::emplace_back<kratos::Stmt*>
                ((vector<kratos::Stmt*,std::allocator<kratos::Stmt*>> *)local_68,(Stmt **)&local_a8)
      ;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_90);
      lVar5 = *(long *)(index + 0xc0);
      lVar7 = *(long *)(index + 200);
    }
    this = (StmtException *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_98,"Unreachable code block",&local_39);
    local_a8._M_current = (Stmt **)local_68._0_8_;
    local_b0._M_current = (Stmt **)local_68._8_8_;
    StmtException::StmtException(this,(string *)local_98,&local_a8,&local_b0);
    __cxa_throw(this,&StmtException::typeinfo,std::runtime_error::~runtime_error);
  }
  StmtBlock::get_stmt((StmtBlock *)local_98,index);
  stmt_00 = local_98;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_90);
  bVar2 = check_stmt_condition((Stmt *)stmt_00,local_48,SUB41(local_34,0),bVar1);
  uVar11 = uVar13;
  if (bVar2) goto LAB_001df7dd;
  uVar13 = uVar13 + 1;
  goto LAB_001df6db;
LAB_001df792:
  if (ppVar6 == (pointer)local_90) {
    p_Var15 = (__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)(local_a0 + 0xc0);
    std::__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)local_68,p_Var15);
    cVar3 = (**(code **)(*(long *)local_68._0_8_ + 0xd0))();
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_68 + 8));
    if (cVar3 == '\0') {
      std::__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)local_68,p_Var15);
      bVar4 = (**(code **)(*(long *)local_68._0_8_ + 0x38))();
      local_38 = local_38 << (bVar4 & 0x1f);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_68 + 8));
    }
    else {
      std::__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)local_68,p_Var15);
      if ((element_type *)local_68._0_8_ == (element_type *)0x0) {
        puVar8 = (undefined8 *)0x0;
      }
      else {
        puVar8 = (undefined8 *)
                 __dynamic_cast(local_68._0_8_,&Var::typeinfo,&EnumType::typeinfo,0xfffffffffffffffe
                               );
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_68 + 8));
      if (puVar8 == (undefined8 *)0x0) {
        pIVar10 = (InternalException *)__cxa_allocate_exception(0x10);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_68,"Unable to resolve enum type",(allocator<char> *)&local_a8);
        InternalException::InternalException(pIVar10,(string *)local_68);
        __cxa_throw(pIVar10,&InternalException::typeinfo,std::runtime_error::~runtime_error);
      }
      lVar5 = (**(code **)*puVar8)(puVar8);
      local_38 = *(uint *)(lVar5 + 0x38);
    }
    if ((char)local_48 == '\0') {
      uVar12 = (uint)(uVar12 != 0);
    }
    else {
      local_68._0_8_ = (element_type *)0x0;
      local_68._8_8_ = 0;
      iVar9 = std::
              _Rb_tree<std::shared_ptr<kratos::Const>,_std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>,_std::_Select1st<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>,_std::less<std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>_>
              ::find((_Rb_tree<std::shared_ptr<kratos::Const>,_std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>,_std::_Select1st<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>,_std::less<std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>_>
                      *)local_98,(key_type *)local_68);
      uVar12 = (uint)(uVar12 == local_38 || iVar9._M_node != (_Base_ptr)local_90);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_68 + 8));
    }
LAB_001df9a0:
    std::
    _Rb_tree<std::shared_ptr<kratos::Const>,_std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>,_std::_Select1st<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>,_std::less<std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::shared_ptr<kratos::Const>,_std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>,_std::_Select1st<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>,_std::less<std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>_>
                 *)local_98);
    return SUB41(uVar12,0);
  }
  bVar2 = check_stmt_condition
                    ((Stmt *)ppVar6[1].first._M_string_length,cond,SUB41(local_34,0),bVar1);
  if (!bVar2 && cVar3 == '\x01') {
    uVar12 = 0;
    goto LAB_001df9a0;
  }
  uVar12 = uVar12 + bVar2;
  ppVar6 = (pointer)std::_Rb_tree_increment((_Rb_tree_node_base *)ppVar6);
  goto LAB_001df792;
}

Assistant:

bool check_stmt_condition(Stmt* stmt, const std::function<bool(Stmt*)>& cond,
                          bool check_unreachable = false, bool full_branch = true) {
    if (cond(stmt)) {
        return true;
    } else if (stmt->type() == StatementType::Block) {
        // it has to be the last block
        uint64_t index;
        bool found = false;
        auto* block = dynamic_cast<StmtBlock*>(stmt);
        if (!block)
            throw InternalException("Statement is not block but is marked as StatementType::Block");
        auto stmt_count = block->size();
        for (index = 0; index < stmt_count; index++) {
            auto* s = block->get_stmt(index).get();
            if (check_stmt_condition(s, cond, check_unreachable, full_branch)) {
                found = true;
                break;
            }
        }
        if (found && check_unreachable) {
            if (index != block->size() - 1) {
                // we have unreachable state
                std::vector<Stmt*> stmts;
                for (uint64_t i = index + 1; i < block->size(); i++)
                    stmts.emplace_back(block->get_stmt(i).get());
                throw StmtException("Unreachable code block", stmts.begin(), stmts.end());
            }
        }
        return found;
    } else if (stmt->type() == StatementType::Switch) {
        auto* stmt_ = dynamic_cast<SwitchStmt*>(stmt);
        if (!stmt_)
            throw InternalException(
                "Statement is not switch but is marked as StatementType::Switch");
        auto cases = stmt_->body();
        if (cases.empty()) return false;
        uint32_t found_case = 0;
        for (auto const& iter : cases) {
            auto* scope_stmt = iter.second.get();
            if (check_stmt_condition(scope_stmt, cond, check_unreachable, full_branch))
                found_case++;
            else if (full_branch)
                return false;
        }
        // make sure default case is covered
        // if there is no default case, all the cases have to be covered
        // the only exception is that if the target is an enum and we've covered all it's enum case
        uint32_t targeted_cases;
        if (stmt_->target()->is_enum()) {
            auto* enum_var = dynamic_cast<EnumType*>(stmt_->target().get());
            if (!enum_var) throw InternalException("Unable to resolve enum type");
            auto const* enum_def = enum_var->enum_type();
            targeted_cases = enum_def->values.size();
        } else {
            targeted_cases = 1u << stmt_->target()->width();
        }
        if (full_branch) {
            return cases.find(nullptr) != cases.end() || found_case == targeted_cases;
        } else {
            return found_case > 0;
        }
    } else if (stmt->type() == StatementType::If) {
        auto* stmt_ = dynamic_cast<IfStmt*>(stmt);
        if (!stmt_)
            throw InternalException("Statement is not if but is marked as StatementType::If");
        auto const& then = stmt_->then_body();
        auto const& else_ = stmt_->else_body();
        if (full_branch) {
            return check_stmt_condition(then.get(), cond, check_unreachable, full_branch) &&
                   check_stmt_condition(else_.get(), cond, check_unreachable, full_branch);
        } else {
            return check_stmt_condition(then.get(), cond, check_unreachable, full_branch) ||
                   check_stmt_condition(else_.get(), cond, check_unreachable, full_branch);
        }
    } else if (stmt->type() == StatementType::For) {
        auto* stmt_ = dynamic_cast<ForStmt*>(stmt);
        if (!stmt_)
            throw InternalException("Statement is not if but is marked as StatementType::For");
        auto body = stmt_->get_loop_body();
        return check_stmt_condition(body.get(), cond, check_unreachable, full_branch);
    }
    return false;
}